

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O1

xmlXPathContextPtr xmlXPtrNewContext(xmlDocPtr doc,xmlNodePtr here,xmlNodePtr origin)

{
  xmlXPathContextPtr pxVar1;
  
  pxVar1 = xmlXPathNewContext(doc);
  return pxVar1;
}

Assistant:

xmlXPathContextPtr
xmlXPtrNewContext(xmlDocPtr doc, xmlNodePtr here, xmlNodePtr origin) {
    xmlXPathContextPtr ret;
    (void) here;
    (void) origin;

    ret = xmlXPathNewContext(doc);
    if (ret == NULL)
	return(ret);

    return(ret);
}